

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O2

void __thiscall
TEST_MemoryLeakDetectorTest_DeleteNonAlocatedMemory_Test::
~TEST_MemoryLeakDetectorTest_DeleteNonAlocatedMemory_Test
          (TEST_MemoryLeakDetectorTest_DeleteNonAlocatedMemory_Test *this)

{
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, DeleteNonAlocatedMemory)
{
    char a;
    char* pa = &a;
    detector->deallocMemory(defaultMallocAllocator(), pa, "FREE.c", 100);
    detector->stopChecking();
    CHECK(reporter->message->contains("Deallocating non-allocated memory"));
    CHECK(reporter->message->contains("   allocated at file: <unknown> line: 0 size: 0 type: unknown"));
    CHECK(reporter->message->contains("   deallocated at file: FREE.c line: 100 type: free"));
}